

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi.c
# Opt level: O0

void Allgather(IceTCommunicator self,void *sendbuf,int sendcount,IceTEnum datatype,void *recvbuf)

{
  undefined *local_30;
  MPI_Datatype mpitype;
  void *recvbuf_local;
  IceTEnum datatype_local;
  int sendcount_local;
  void *sendbuf_local;
  IceTCommunicator self_local;
  
  switch(datatype) {
  case 0x8000:
    local_30 = &ompi_mpi_byte;
    break;
  case 0x8001:
    local_30 = &ompi_mpi_byte;
    break;
  case 0x8002:
    local_30 = &ompi_mpi_short;
    break;
  case 0x8003:
    local_30 = &ompi_mpi_int;
    break;
  case 0x8004:
    local_30 = &ompi_mpi_float;
    break;
  case 0x8005:
    local_30 = &ompi_mpi_double;
    break;
  default:
    icetRaiseDiagnostic("MPI Communicator received bad data type.",0xfffffffe,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/communication/mpi.c"
                        ,0x165);
    local_30 = &ompi_mpi_byte;
  }
  _datatype_local = sendbuf;
  if (sendbuf == (void *)0xffffffffffffffff) {
    _datatype_local = (void *)0x1;
  }
  MPI_Allgather(_datatype_local,sendcount,local_30,recvbuf,sendcount,local_30,*self->data);
  return;
}

Assistant:

static void Allgather(IceTCommunicator self,
                      const void *sendbuf,
                      int sendcount,
                      IceTEnum datatype,
                      void *recvbuf)
{
    MPI_Datatype mpitype;
    CONVERT_DATATYPE(datatype, mpitype);

    if (sendbuf == ICET_IN_PLACE_COLLECT) {
        sendbuf = MPI_IN_PLACE;
    }

    MPI_Allgather((void *)sendbuf, sendcount, mpitype,
                  recvbuf, sendcount, mpitype,
                  MPI_COMM);
}